

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void __thiscall
dg::dda::MemorySSATransformation::collectAllDefinitions
          (MemorySSATransformation *this,Definitions *defs,RWBBlock *from,
          set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
          *visitedBlocks,bool escaping)

{
  RWBBlock *from_00;
  Definitions *from_01;
  pointer ppRVar1;
  pair<std::_Rb_tree_iterator<dg::dda::RWBBlock_*>,_bool> pVar2;
  RWBBlock *from_local;
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  *local_118;
  DefinitionsMap<dg::dda::RWNode> *local_110;
  MemorySSATransformation *local_108;
  pointer local_100;
  Definitions tmpDefs;
  DefinitionsMap<dg::dda::RWNode> olddefinitions;
  
  from_local = from;
  local_118 = visitedBlocks;
  pVar2 = std::
          _Rb_tree<dg::dda::RWBBlock*,dg::dda::RWBBlock*,std::_Identity<dg::dda::RWBBlock*>,std::less<dg::dda::RWBBlock*>,std::allocator<dg::dda::RWBBlock*>>
          ::_M_insert_unique<dg::dda::RWBBlock*const&>
                    ((_Rb_tree<dg::dda::RWBBlock*,dg::dda::RWBBlock*,std::_Identity<dg::dda::RWBBlock*>,std::less<dg::dda::RWBBlock*>,std::allocator<dg::dda::RWBBlock*>>
                      *)visitedBlocks,&from_local);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    from_01 = getBBlockDefinitions(this,from_local,(DefSite *)0x0);
    joinDefinitions(from_01,defs,escaping);
    ppRVar1 = *(pointer *)
               ((long)&(from_local->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                       super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                       _predecessors.
                       super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    if (((long)ppRVar1 -
         (long)(from_local->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
               super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
               _predecessors.
               super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl
               .super__Vector_impl_data._M_start == 8) &&
       (from_00 = ppRVar1[-1], from_00 != (RWBBlock *)0x0)) {
      collectAllDefinitions(this,defs,from_00,local_118,escaping);
    }
    else {
      local_110 = &defs->definitions;
      local_108 = this;
      std::
      _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&olddefinitions,
                   (_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)local_110);
      local_100 = *(pointer *)
                   ((long)&(from_local->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                           super_CFGElement<dg::dda::RWBBlock>.
                           super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
                           super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
      for (ppRVar1 = (from_local->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _predecessors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppRVar1 != local_100;
          ppRVar1 = ppRVar1 + 1) {
        tmpDefs._processed = false;
        tmpDefs.definitions._definitions._M_h._M_buckets =
             &tmpDefs.definitions._definitions._M_h._M_single_bucket;
        tmpDefs.definitions._definitions._M_h._M_bucket_count = 1;
        tmpDefs.definitions._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        tmpDefs.definitions._definitions._M_h._M_element_count = 0;
        tmpDefs.definitions._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        tmpDefs.definitions._definitions._M_h._M_rehash_policy._4_4_ = 0;
        tmpDefs.definitions._definitions._M_h._M_rehash_policy._M_next_resize = 0;
        tmpDefs.definitions._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
        tmpDefs.kills._definitions._M_h._M_buckets =
             &tmpDefs.kills._definitions._M_h._M_single_bucket;
        tmpDefs.kills._definitions._M_h._M_bucket_count = 1;
        tmpDefs.kills._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        tmpDefs.kills._definitions._M_h._M_element_count = 0;
        tmpDefs.kills._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        tmpDefs.kills._definitions._M_h._M_rehash_policy._4_4_ = 0;
        tmpDefs.unknownWrites.
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tmpDefs.unknownWrites.
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tmpDefs.kills._definitions._M_h._M_rehash_policy._M_next_resize = 0;
        tmpDefs.kills._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
        tmpDefs.unknownWrites.
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::operator=((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&tmpDefs.definitions,
                    (_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&olddefinitions);
        collectAllDefinitions(local_108,&tmpDefs,*ppRVar1,local_118,escaping);
        DefinitionsMap<dg::dda::RWNode>::add(local_110,&tmpDefs.definitions);
        std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
        insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
                  ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&defs->unknownWrites
                   ,(const_iterator)
                    (defs->unknownWrites).
                    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                    )tmpDefs.unknownWrites.
                     super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                    )tmpDefs.unknownWrites.
                     super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        Definitions::~Definitions(&tmpDefs);
      }
      std::
      _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&olddefinitions);
    }
  }
  return;
}

Assistant:

void MemorySSATransformation::collectAllDefinitions(
        Definitions &defs, RWBBlock *from, std::set<RWBBlock *> &visitedBlocks,
        bool escaping) {
    assert(from);

    if (!visitedBlocks.insert(from).second) {
        return; // we already visited this block
    }

    // get the definitions from this block
    joinDefinitions(getBBlockDefinitions(from), defs, escaping);

    // recur into predecessors
    if (auto *singlePred = from->getSinglePredecessor()) {
        collectAllDefinitions(defs, singlePred, visitedBlocks, escaping);
    } else {
        auto olddefinitions = defs.definitions;
        for (auto I = from->pred_begin(), E = from->pred_end(); I != E; ++I) {
            Definitions tmpDefs;
            tmpDefs.definitions = olddefinitions;
            collectAllDefinitions(tmpDefs, *I, visitedBlocks, escaping);
            defs.definitions.add(tmpDefs.definitions);
            defs.unknownWrites.insert(defs.unknownWrites.end(),
                                      tmpDefs.unknownWrites.begin(),
                                      tmpDefs.unknownWrites.end());
        }
    }
}